

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_io.cpp
# Opt level: O1

adios2_error adios2_inquire_subgroups(char ***results,char *full_prefix,size_t *size,adios2_io *io)

{
  char *pcVar1;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var2;
  size_t sVar3;
  long lVar4;
  const_iterator cVar5;
  char **ppcVar6;
  void *pvVar7;
  _Base_ptr p_Var8;
  long *plVar9;
  byte *__size;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subGrpNames;
  undefined1 *local_e8;
  ulong local_e0;
  undefined1 local_d8 [16];
  ulong local_c8;
  char *local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  size_t *local_68;
  long local_60;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_58;
  string local_50;
  
  local_c0 = full_prefix;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"for adios2_io, in call to adios2_inquire_all_variables","");
  adios2::helper::CheckForNullptr<adios2_io>(io,&local_50);
  local_68 = size;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  p_Var2 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            *)adios2::core::IO::GetVariables_abi_cxx11_();
  local_60 = adios2::core::IO::GetAttributes_abi_cxx11_();
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  sVar3 = strlen(local_c0);
  plVar9 = *(long **)(p_Var2 + 0x10);
  local_58 = p_Var2;
  if (plVar9 != (long *)0x0) {
    local_c8 = sVar3 + 1;
    do {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,plVar9[1],plVar9[2] + plVar9[1])
      ;
      pcVar1 = local_c0;
      if (sVar3 < local_e0) {
        strlen(local_c0);
        lVar4 = std::__cxx11::string::find((char *)&local_e8,(ulong)pcVar1,0);
        if ((lVar4 == 0) &&
           (lVar4 = std::__cxx11::string::find((char *)&local_e8,0x12979f,local_c8), lVar4 != -1)) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_e8);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_98,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
        }
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  plVar9 = *(long **)(local_60 + 0x10);
  if (plVar9 != (long *)0x0) {
    local_c8 = sVar3 + 1;
    do {
      local_e8 = local_d8;
      std::__cxx11::string::_M_construct<char*>((string *)&local_e8,plVar9[1],plVar9[2] + plVar9[1])
      ;
      pcVar1 = local_c0;
      if (sVar3 < local_e0) {
        strlen(local_c0);
        lVar4 = std::__cxx11::string::find((char *)&local_e8,(ulong)pcVar1,0);
        if ((lVar4 == 0) &&
           (lVar4 = std::__cxx11::string::find((char *)&local_e8,0x12979f,local_c8), lVar4 != -1)) {
          std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_e8);
          cVar5 = std::
                  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  ::find(local_58,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p);
          }
          if (cVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<adios2::core::VariableBase,_std::default_delete<adios2::core::VariableBase>_>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::__cxx11::string::substr((ulong)&local_b8,(ulong)&local_e8);
            std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_98,&local_b8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
          }
        }
      }
      if (local_e8 != local_d8) {
        operator_delete(local_e8);
      }
      plVar9 = (long *)*plVar9;
    } while (plVar9 != (long *)0x0);
  }
  *local_68 = local_98._M_impl.super__Rb_tree_header._M_node_count;
  ppcVar6 = (char **)malloc(local_98._M_impl.super__Rb_tree_header._M_node_count << 3);
  *results = ppcVar6;
  if ((_Rb_tree_header *)local_98._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_98._M_impl.super__Rb_tree_header) {
    lVar4 = 0;
    p_Var8 = local_98._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __size = (byte *)((long)&(p_Var8[1]._M_parent)->_M_color + 1);
      pvVar7 = malloc((size_t)__size);
      *(void **)((long)*results + lVar4) = pvVar7;
      snprintf(*(char **)((long)*results + lVar4),(size_t)__size,"%s",*(undefined8 *)(p_Var8 + 1));
      *(undefined1 *)((long)&(p_Var8[1]._M_parent)->_M_color + *(long *)((long)*results + lVar4)) =
           0;
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
      lVar4 = lVar4 + 8;
    } while ((_Rb_tree_header *)p_Var8 != &local_98._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_98);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_inquire_subgroups(char ***results, const char *full_prefix, size_t *size,
                                      adios2_io *io)
{
    try
    {
        adios2::helper::CheckForNullptr(io,
                                        "for adios2_io, in call to adios2_inquire_all_variables");

        adios2::core::IO &ioCpp = *reinterpret_cast<adios2::core::IO *>(io);
        const auto &dataMapVar = ioCpp.GetVariables();
        const auto &dataMapAttr = ioCpp.GetAttributes();

        std::set<std::string> subGrpNames;
        size_t prefix_size = strlen(full_prefix);

        for (auto &it : dataMapVar)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.find("/", prefix_size + 1);
                if (pos != std::string::npos)
                    subGrpNames.insert(curr.substr(prefix_size, pos - prefix_size));
            }
        }

        for (auto &it : dataMapAttr)
        {
            auto curr = it.first;
            if ((curr.size() > prefix_size) && (0 == curr.find(full_prefix)))
            {
                auto pos = curr.find("/", prefix_size + 1);
                if (pos != std::string::npos)
                {
                    auto hasVar = dataMapVar.find(curr.substr(0, pos));
                    if (hasVar == dataMapVar.end())
                        subGrpNames.insert(curr.substr(prefix_size, pos - prefix_size));
                    // else
                    // std::cout<<" .. found a variable! "<<curr<<std::endl;
                }
            }
        }

        *size = subGrpNames.size();
        *results = (char **)malloc(sizeof(char *) * (*size));

        // std::cout<<" subgroup of: "<<full_prefix<<std::endl;
        int i = 0;
        for (auto &m : subGrpNames)
        {
            (*results)[i] = (char *)malloc(m.size() + 1);
            snprintf((*results)[i], m.size() + 1, "%s", m.c_str());
            (*results)[i][m.size()] = '\0';
            i++;
        }

        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(
            adios2::helper::ExceptionToError("adios2_inquire_all_variables"));
    }
}